

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O3

void __thiscall
cmFortranParser_s::cmFortranParser_s
          (cmFortranParser_s *this,cmFortranCompiler *fc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,cmFortranSourceInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  yyscan_t *ptr_yy_globals;
  pointer pcVar3;
  undefined8 uVar4;
  pointer pbVar5;
  YY_BUFFER_STATE new_buffer;
  
  paVar1 = &(this->Compiler).Id.field_2;
  (this->Compiler).Id._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (fc->Id)._M_dataplus._M_p;
  paVar2 = &(fc->Id).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(fc->Id).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Compiler).Id.field_2 + 8) = uVar4;
  }
  else {
    (this->Compiler).Id._M_dataplus._M_p = pcVar3;
    (this->Compiler).Id.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Compiler).Id._M_string_length = (fc->Id)._M_string_length;
  (fc->Id)._M_dataplus._M_p = (pointer)paVar2;
  (fc->Id)._M_string_length = 0;
  (fc->Id).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->Compiler).SModSep.field_2;
  (this->Compiler).SModSep._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (fc->SModSep)._M_dataplus._M_p;
  paVar2 = &(fc->SModSep).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(fc->SModSep).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Compiler).SModSep.field_2 + 8) = uVar4;
  }
  else {
    (this->Compiler).SModSep._M_dataplus._M_p = pcVar3;
    (this->Compiler).SModSep.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Compiler).SModSep._M_string_length = (fc->SModSep)._M_string_length;
  (fc->SModSep)._M_dataplus._M_p = (pointer)paVar2;
  (fc->SModSep)._M_string_length = 0;
  (fc->SModSep).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->Compiler).SModExt.field_2;
  (this->Compiler).SModExt._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (fc->SModExt)._M_dataplus._M_p;
  paVar2 = &(fc->SModExt).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(fc->SModExt).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Compiler).SModExt.field_2 + 8) = uVar4;
  }
  else {
    (this->Compiler).SModExt._M_dataplus._M_p = pcVar3;
    (this->Compiler).SModExt.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Compiler).SModExt._M_string_length = (fc->SModExt)._M_string_length;
  (fc->SModExt)._M_dataplus._M_p = (pointer)paVar2;
  (fc->SModExt)._M_string_length = 0;
  (fc->SModExt).field_2._M_local_buf[0] = '\0';
  pbVar5 = (includes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (includes->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
  (this->IncludePath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (includes->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (includes->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (includes->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (includes->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>::_M_initialize_map
            ((_Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_> *)&this->FileStack,0);
  (this->TokenString)._M_dataplus._M_p = (pointer)&(this->TokenString).field_2;
  (this->TokenString)._M_string_length = 0;
  (this->TokenString).field_2._M_local_buf[0] = '\0';
  (this->Error)._M_dataplus._M_p = (pointer)&(this->Error).field_2;
  (this->Error)._M_string_length = 0;
  (this->Error).field_2._M_local_buf[0] = '\0';
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header,
             &(defines->_M_t)._M_impl.super__Rb_tree_header);
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  std::_Deque_base<bool,_std::allocator<bool>_>::_M_initialize_map
            ((_Deque_base<bool,_std::allocator<bool>_> *)&this->SkipToEnd,0);
  this->Info = info;
  this->InInterface = false;
  this->InPPFalseBranch = 0;
  ptr_yy_globals = &this->Scanner;
  cmFortran_yylex_init(ptr_yy_globals);
  cmFortran_yyset_extra(this,this->Scanner);
  new_buffer = cmFortran_yy_create_buffer((FILE *)0x0,4,*ptr_yy_globals);
  cmFortran_yy_switch_to_buffer(new_buffer,*ptr_yy_globals);
  return;
}

Assistant:

cmFortranParser_s::cmFortranParser_s(cmFortranCompiler fc,
                                     std::vector<std::string> includes,
                                     std::set<std::string> defines,
                                     cmFortranSourceInfo& info)
  : Compiler(std::move(fc))
  , IncludePath(std::move(includes))
  , PPDefinitions(std::move(defines))
  , Info(info)
{
  this->InInterface = false;
  this->InPPFalseBranch = 0;

  // Initialize the lexical scanner.
  cmFortran_yylex_init(&this->Scanner);
  cmFortran_yyset_extra(this, this->Scanner);

  // Create a dummy buffer that is never read but is the fallback
  // buffer when the last file is popped off the stack.
  YY_BUFFER_STATE buffer =
    cmFortran_yy_create_buffer(nullptr, 4, this->Scanner);
  cmFortran_yy_switch_to_buffer(buffer, this->Scanner);
}